

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

_Bool pmsav8_mpu_lookup_arm
                (CPUARMState *env,uint32_t address,MMUAccessType access_type,ARMMMUIdx mmu_idx,
                hwaddr *phys_ptr,MemTxAttrs *txattrs,int *prot,_Bool *is_subpage,
                ARMMMUFaultInfo_conflict *fi,uint32_t *mregion)

{
  uc_struct_conflict1 *puVar1;
  _Bool _Var2;
  _Bool _Var3;
  _Bool _Var4;
  ARMMMUIdx AVar5;
  uint32_t uVar6;
  uint uVar7;
  uint uVar8;
  int ap;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  bool bVar13;
  
  puVar1 = env->uc;
  AVar5 = address;
  _Var2 = regime_is_user((CPUARMState *)(ulong)mmu_idx,address);
  _Var3 = regime_is_secure((CPUARMState *)(ulong)mmu_idx,AVar5);
  uVar8 = puVar1->init_target_page->mask;
  *is_subpage = false;
  *phys_ptr = (ulong)address;
  *prot = 0;
  if (mregion != (uint32_t *)0x0) {
    *mregion = 0xffffffff;
  }
  _Var4 = regime_translation_disabled(env,mmu_idx);
  if ((!_Var4) && (_Var4 = m_is_ppb_region(env,address), !_Var4)) {
    uVar9 = uVar8 & address;
    _Var2 = pmsav7_use_background_region
                      ((ARMCPU *)(env[-10].cp15.c14_pmevcntr + 0x1b),mmu_idx,_Var2);
    uVar7 = *(uint *)((long)env[1].xregs + 0x1c);
    uVar12 = 0xffffffff;
    while (0 < (int)uVar7) {
      uVar7 = uVar7 - 1;
      uVar10 = (env->pmsav8).rlar[_Var3][uVar7];
      if ((uVar10 & 1) != 0) {
        uVar11 = (env->pmsav8).rbar[_Var3][uVar7] & 0xffffffe0;
        uVar10 = uVar10 | 0x1f;
        if ((address < uVar11) || (uVar10 < address)) {
          if (((uVar11 <= uVar10) &&
              ((ulong)uVar9 <= ((ulong)((uVar10 - uVar11) + 1) + (ulong)uVar11) - 1)) &&
             ((ulong)uVar11 <= ((ulong)uVar9 - 1) - (long)puVar1->init_target_page->mask)) {
            *is_subpage = true;
          }
        }
        else {
          if ((uVar9 < uVar11) || (uVar10 < ~uVar8 + uVar9)) {
            *is_subpage = true;
          }
          _Var2 = true;
          bVar13 = uVar12 != 0xffffffff;
          uVar12 = uVar7;
          if (bVar13) {
            fi->type = ARMFault_Permission;
            *(undefined4 *)((long)&fi->s2addr + 4) = 1;
            return true;
          }
        }
      }
    }
    if (_Var2 == false) {
      fi->type = ARMFault_Background;
      return true;
    }
    if (uVar12 != 0xffffffff) {
      AVar5 = extract32((env->pmsav8).rbar[_Var3][uVar12],1,2);
      uVar6 = extract32((env->pmsav8).rbar[_Var3][uVar12],0,1);
      _Var2 = m_is_system_region(env,address);
      uVar7 = simple_ap_to_rw_prot((CPUARMState *)(ulong)mmu_idx,AVar5,ap);
      uVar8 = uVar7 | 4;
      if (uVar6 != 0) {
        uVar8 = uVar7;
      }
      if (_Var2) {
        uVar8 = uVar7;
      }
      if (uVar7 == 0) {
        uVar8 = uVar7;
      }
      *prot = uVar8;
      if (mregion != (uint32_t *)0x0) {
        *mregion = uVar12;
      }
      goto LAB_005305c2;
    }
  }
  get_phys_addr_pmsav7_default(env,mmu_idx,address,prot);
LAB_005305c2:
  fi->type = ARMFault_Permission;
  *(undefined4 *)((long)&fi->s2addr + 4) = 1;
  return ((uint)*prot >> (access_type & 0x1f) & 1) == 0;
}

Assistant:

bool pmsav8_mpu_lookup(CPUARMState *env, uint32_t address,
                              MMUAccessType access_type, ARMMMUIdx mmu_idx,
                              hwaddr *phys_ptr, MemTxAttrs *txattrs,
                              int *prot, bool *is_subpage,
                              ARMMMUFaultInfo *fi, uint32_t *mregion)
{
    struct uc_struct *uc = env->uc;
    /* Perform a PMSAv8 MPU lookup (without also doing the SAU check
     * that a full phys-to-virt translation does).
     * mregion is (if not NULL) set to the region number which matched,
     * or -1 if no region number is returned (MPU off, address did not
     * hit a region, address hit in multiple regions).
     * We set is_subpage to true if the region hit doesn't cover the
     * entire TARGET_PAGE the address is within.
     */
    ARMCPU *cpu = env_archcpu(env);
    bool is_user = regime_is_user(env, mmu_idx);
    uint32_t secure = regime_is_secure(env, mmu_idx);
    int n;
    int matchregion = -1;
    bool hit = false;
    uint32_t addr_page_base = address & TARGET_PAGE_MASK;
    uint32_t addr_page_limit = addr_page_base + (TARGET_PAGE_SIZE - 1);

    *is_subpage = false;
    *phys_ptr = address;
    *prot = 0;
    if (mregion) {
        *mregion = -1;
    }

    /* Unlike the ARM ARM pseudocode, we don't need to check whether this
     * was an exception vector read from the vector table (which is always
     * done using the default system address map), because those accesses
     * are done in arm_v7m_load_vector(), which always does a direct
     * read using address_space_ldl(), rather than going via this function.
     */
    if (regime_translation_disabled(env, mmu_idx)) { /* MPU disabled */
        hit = true;
    } else if (m_is_ppb_region(env, address)) {
        hit = true;
    } else {
        if (pmsav7_use_background_region(cpu, mmu_idx, is_user)) {
            hit = true;
        }

        for (n = (int)cpu->pmsav7_dregion - 1; n >= 0; n--) {
            /* region search */
            /* Note that the base address is bits [31:5] from the register
             * with bits [4:0] all zeroes, but the limit address is bits
             * [31:5] from the register with bits [4:0] all ones.
             */
            uint32_t base = env->pmsav8.rbar[secure][n] & ~0x1f;
            uint32_t limit = env->pmsav8.rlar[secure][n] | 0x1f;

            if (!(env->pmsav8.rlar[secure][n] & 0x1)) {
                /* Region disabled */
                continue;
            }

            if (address < base || address > limit) {
                /*
                 * Address not in this region. We must check whether the
                 * region covers addresses in the same page as our address.
                 * In that case we must not report a size that covers the
                 * whole page for a subsequent hit against a different MPU
                 * region or the background region, because it would result in
                 * incorrect TLB hits for subsequent accesses to addresses that
                 * are in this MPU region.
                 */
                if (limit >= base &&
                    ranges_overlap(base, limit - base + 1,
                                   addr_page_base,
                                   TARGET_PAGE_SIZE)) {
                    *is_subpage = true;
                }
                continue;
            }

            if (base > addr_page_base || limit < addr_page_limit) {
                *is_subpage = true;
            }

            if (matchregion != -1) {
                /* Multiple regions match -- always a failure (unlike
                 * PMSAv7 where highest-numbered-region wins)
                 */
                fi->type = ARMFault_Permission;
                fi->level = 1;
                return true;
            }

            matchregion = n;
            hit = true;
        }
    }

    if (!hit) {
        /* background fault */
        fi->type = ARMFault_Background;
        return true;
    }

    if (matchregion == -1) {
        /* hit using the background region */
        get_phys_addr_pmsav7_default(env, mmu_idx, address, prot);
    } else {
        uint32_t ap = extract32(env->pmsav8.rbar[secure][matchregion], 1, 2);
        uint32_t xn = extract32(env->pmsav8.rbar[secure][matchregion], 0, 1);

        if (m_is_system_region(env, address)) {
            /* System space is always execute never */
            xn = 1;
        }

        *prot = simple_ap_to_rw_prot(env, mmu_idx, ap);
        if (*prot && !xn) {
            *prot |= PAGE_EXEC;
        }
        /* We don't need to look the attribute up in the MAIR0/MAIR1
         * registers because that only tells us about cacheability.
         */
        if (mregion) {
            *mregion = matchregion;
        }
    }

    fi->type = ARMFault_Permission;
    fi->level = 1;
    return !(*prot & (1 << access_type));
}